

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::
state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::lock_and_swap_queue
          (state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,event_queue *queue)

{
  size_type __i;
  no_lock local_19;
  event_queue *peStack_18;
  lock_guard lock;
  event_queue *queue_local;
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *this_local;
  
  peStack_18 = queue;
  detail::no_lock::no_lock(&local_19,(none *)&this->field_0x98);
  std::
  swap<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
            (&this->queued_events_,peStack_18);
  __i = std::
        deque<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
        ::size(peStack_18);
  std::__atomic_base<unsigned_long>::operator-=
            (&(this->queue_size_).super___atomic_base<unsigned_long>,__i);
  return;
}

Assistant:

void
    lock_and_swap_queue(event_queue& queue)
    {
        lock_guard lock{mutex_};
        ::std::swap(queued_events_, queue);
        queue_size_ -= queue.size();
    }